

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O3

int __thiscall String::compareIgnoreCase(String *this,String *other)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  
  pbVar1 = (byte *)operator_cast_to_char_(this);
  pbVar2 = (byte *)operator_cast_to_char_(other);
  uVar3 = (ulong)*pbVar1;
  bVar5 = lowerCaseMap[uVar3];
  bVar6 = lowerCaseMap[*pbVar2];
  if (bVar5 == bVar6) {
    lVar4 = 1;
    do {
      if ((char)uVar3 == '\0') {
        return 0;
      }
      uVar3 = (ulong)pbVar1[lVar4];
      bVar5 = lowerCaseMap[uVar3];
      bVar6 = lowerCaseMap[pbVar2[lVar4]];
      lVar4 = lVar4 + 1;
    } while (bVar5 == bVar6);
  }
  return (uint)bVar5 - (uint)bVar6;
}

Assistant:

int compareIgnoreCase(const String& other) const
  {
    const char* s1 = *this, * s2 = other;
    char c1, c2;
    for(; (c1 = toLowerCase(*s1)) == (c2 = toLowerCase(*s2)); ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)(const uchar&)c1 - (const uchar&)c2;
  }